

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O1

void __thiscall crnlib::qdxt1::optimize_selectors_task(qdxt1 *this,uint64 data,void *pData_ptr)

{
  uint uVar1;
  dxt_pixel_block *pdVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  crn_thread_id_t cVar7;
  uint *puVar8;
  uint uVar9;
  int iVar10;
  uint *puVar11;
  int iVar12;
  long *plVar13;
  ulong uVar14;
  long lVar15;
  uint s;
  long lVar16;
  vector<unsigned_int> *pvVar17;
  ulong uVar18;
  bool bVar19;
  dxt1_block blk;
  color_quad_u8 colors [4];
  uint *apuStack_c8 [2];
  vector<unsigned_int> local_b8;
  vector<unsigned_int> local_a8;
  long local_98;
  long local_90;
  undefined8 local_88;
  int local_7c;
  color_quad_u8 local_78 [4];
  ulong local_68;
  vector<unsigned_int> *local_60;
  long *local_58;
  uint64 local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  local_a8.m_p = (uint *)0x0;
  local_a8.m_size = 0;
  local_a8.m_capacity = 0;
  local_b8.m_p = (uint *)0x0;
  local_b8.m_size = 0;
  local_b8.m_capacity = 0;
  apuStack_c8[1] = (uint *)0x1449ff;
  local_50 = data;
  vector<unsigned_int>::reserve(&local_b8,0x800);
  apuStack_c8[1] = (uint *)0x144a11;
  vector<unsigned_int>::reserve(&local_a8,0x800);
  if (*(int *)(*pData_ptr + 8) != 0) {
    uVar18 = 0;
    do {
      if (this->m_canceled != false) break;
      if ((char)uVar18 == '\0') {
        apuStack_c8[1] = (uint *)0x144a36;
        cVar7 = crn_get_current_thread_id();
        if (cVar7 == this->m_main_thread_id) {
          apuStack_c8[1] = (uint *)0x144a4f;
          bVar4 = update_progress(this,(uint)uVar18,*(int *)(*pData_ptr + 8) - 1);
          if (!bVar4) break;
        }
      }
      uVar1 = this->m_pTask_pool->m_num_threads;
      if ((uVar1 == 0) || ((int)((uVar18 & 0xffffffff) % (ulong)(uVar1 + 1)) == (int)local_50)) {
        if (1 < *(uint *)(**pData_ptr + 8 + uVar18 * 0x10)) {
          if (local_b8.m_size != 0) {
            local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
          }
          local_68 = uVar18;
          if (local_a8.m_size != 0) {
            local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
          }
          plVar13 = (long *)(**pData_ptr + uVar18 * 0x10);
          if ((int)plVar13[1] != 0) {
            uVar18 = 0;
            do {
              uVar6 = *(uint *)(*plVar13 + uVar18 * 4);
              uVar9 = this->m_elements_per_block * uVar6;
              if (*(ushort *)this->m_pDst_elements[uVar9].m_high_color <
                  *(ushort *)this->m_pDst_elements[uVar9].m_low_color) {
                if (local_b8.m_capacity <= local_b8.m_size) {
                  apuStack_c8[1] = (uint *)0x144b12;
                  elemental_vector::increase_capacity
                            ((elemental_vector *)&local_b8,local_b8.m_size + 1,true,4,
                             (object_mover)0x0,false);
                }
                pvVar17 = &local_b8;
                puVar8 = local_b8.m_p;
LAB_00144b8a:
                puVar11 = &pvVar17->m_size;
                puVar8[*puVar11] = uVar6;
                *puVar11 = *puVar11 + 1;
              }
              else {
                uVar9 = (this->m_params).m_dxt1a_alpha_threshold;
                if (uVar9 == 0) {
LAB_00144b5c:
                  if (local_a8.m_capacity <= local_a8.m_size) {
                    apuStack_c8[1] = (uint *)0x144b80;
                    elemental_vector::increase_capacity
                              ((elemental_vector *)&local_a8,local_a8.m_size + 1,true,4,
                               (object_mover)0x0,false);
                  }
                  pvVar17 = &local_a8;
                  puVar8 = local_a8.m_p;
                  goto LAB_00144b8a;
                }
                uVar14 = 0;
                do {
                  bVar4 = false;
                  if (this->m_pBlocks[uVar6].m_pixels[0][uVar14].field_0.field_0.a < uVar9) {
                    bVar4 = true;
                    break;
                  }
                  bVar19 = uVar14 < 0xf;
                  uVar14 = uVar14 + 1;
                } while (bVar19);
                if (!bVar4) goto LAB_00144b5c;
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 < *(uint *)(plVar13 + 1));
          }
          local_88 = 0;
          lVar15 = 0;
          local_58 = (long *)pData_ptr;
          uVar18 = local_68;
          do {
            lVar16 = lVar15;
            if (1 < (&local_b8)[lVar15].m_size) {
              pvVar17 = &local_b8 + lVar15;
              local_48 = lVar15;
              local_40 = (ulong)(lVar15 != 1) + 3;
              local_98 = 0;
              local_60 = pvVar17;
              do {
                local_90 = 0;
                do {
                  lVar15 = 0;
                  uVar18 = 0xffffffffff;
                  iVar10 = 0;
                  do {
                    local_38 = uVar18;
                    local_7c = iVar10;
                    if (pvVar17->m_size == 0) {
                      uVar14 = 0;
                    }
                    else {
                      uVar18 = 0;
                      uVar14 = 0;
                      do {
                        uVar6 = pvVar17->m_p[uVar18];
                        pdVar2 = this->m_pBlocks;
                        uVar9 = this->m_elements_per_block * uVar6;
                        apuStack_c8[1] = (uint *)0x144c54;
                        dxt1_block::get_block_colors
                                  (local_78,*(uint16 *)this->m_pDst_elements[uVar9].m_low_color,
                                   *(uint16 *)this->m_pDst_elements[uVar9].m_high_color);
                        iVar10 = (uint)pdVar2[uVar6].m_pixels[local_98][local_90].field_0.field_0.r
                                 - (uint)local_78[lVar15].field_0.field_0.r;
                        uVar9 = (uint)pdVar2[uVar6].m_pixels[local_98][local_90].field_0.field_0.g;
                        uVar6 = (uint)pdVar2[uVar6].m_pixels[local_98][local_90].field_0.field_0.b;
                        if ((this->m_params).m_perceptual == true) {
                          iVar12 = uVar9 - local_78[lVar15].field_0.field_0.g;
                          iVar5 = uVar6 - local_78[lVar15].field_0.field_0.b;
                          uVar6 = iVar5 * iVar5 + iVar12 * iVar12 * 0x19 + iVar10 * iVar10 * 8;
                        }
                        else {
                          iVar12 = uVar9 - local_78[lVar15].field_0.field_0.g;
                          iVar5 = uVar6 - local_78[lVar15].field_0.field_0.b;
                          uVar6 = iVar5 * iVar5 + iVar12 * iVar12 + iVar10 * iVar10;
                        }
                        uVar14 = uVar14 + uVar6;
                        uVar18 = uVar18 + 1;
                        pvVar17 = local_60;
                      } while (uVar18 < local_60->m_size);
                    }
                    uVar18 = local_38;
                    iVar10 = local_7c;
                    if (uVar14 < local_38) {
                      uVar18 = uVar14;
                      iVar10 = (int)lVar15;
                    }
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != local_40);
                  bVar3 = (char)local_90 * '\x02';
                  *(byte *)((long)&local_88 + local_98 + 4) =
                       (byte)(iVar10 << (bVar3 & 0x1f)) |
                       ~(byte)(3 << (bVar3 & 0x1f)) & *(byte *)((long)&local_88 + local_98 + 4);
                  local_90 = local_90 + 1;
                } while (local_90 != 4);
                local_98 = local_98 + 1;
              } while (local_98 != 4);
              lVar16 = local_48;
              uVar18 = local_68;
              pData_ptr = local_58;
              if (pvVar17->m_size != 0) {
                uVar14 = 0;
                do {
                  *(undefined4 *)
                   this->m_pDst_elements[this->m_elements_per_block * pvVar17->m_p[uVar14]].
                   m_selectors = local_88._4_4_;
                  uVar14 = uVar14 + 1;
                } while (uVar14 < pvVar17->m_size);
              }
            }
            lVar15 = lVar16 + 1;
          } while (lVar16 == 0);
        }
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < *(uint *)(*pData_ptr + 8));
  }
  lVar15 = 0x20;
  do {
    if (*(void **)((long)apuStack_c8 + lVar15) != (void *)0x0) {
      apuStack_c8[1] = (uint *)0x144dc7;
      crnlib_free(*(void **)((long)apuStack_c8 + lVar15));
    }
    lVar15 = lVar15 + -0x10;
  } while (lVar15 != 0);
  return;
}

Assistant:

void qdxt1::optimize_selectors_task(uint64 data, void* pData_ptr) {
  const uint thread_index = static_cast<uint>(data);

  optimize_selectors_params& task_params = *static_cast<optimize_selectors_params*>(pData_ptr);

  crnlib::vector<uint> block_categories[2];
  block_categories[0].reserve(2048);
  block_categories[1].reserve(2048);

  for (uint cluster_index = 0; cluster_index < task_params.m_selector_cluster_indices.size(); cluster_index++) {
    if (m_canceled)
      return;

    if ((cluster_index & 255) == 0) {
      if (crn_get_current_thread_id() == m_main_thread_id) {
        if (!update_progress(cluster_index, task_params.m_selector_cluster_indices.size() - 1))
          return;
      }
    }

    if (m_pTask_pool->get_num_threads()) {
      if ((cluster_index % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
        continue;
    }

    const crnlib::vector<uint>& selector_indices = task_params.m_selector_cluster_indices[cluster_index];

    if (selector_indices.size() <= 1)
      continue;

    block_categories[0].resize(0);
    block_categories[1].resize(0);

    for (uint block_iter = 0; block_iter < selector_indices.size(); block_iter++) {
      const uint block_index = selector_indices[block_iter];

      const dxt1_block& src_block = get_block(block_index);

      if (!src_block.is_alpha_block())
        block_categories[0].push_back(block_index);
      else {
        bool has_alpha_pixels = false;

        if (m_params.m_dxt1a_alpha_threshold > 0) {
          const color_quad_u8* pSrc_pixels = (const color_quad_u8*)m_pBlocks[block_index].m_pixels;

          for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++) {
            const color_quad_u8& src = pSrc_pixels[i];
            if (src.a < m_params.m_dxt1a_alpha_threshold) {
              has_alpha_pixels = true;
              break;
            }
          }
        }

        if (has_alpha_pixels)
          continue;

        block_categories[1].push_back(block_index);
      }
    }

    dxt1_block blk;
    utils::zero_object(blk);

    for (uint block_type = 0; block_type <= 1; block_type++) {
      const crnlib::vector<uint>& block_indices = block_categories[block_type];
      if (block_indices.size() <= 1)
        continue;

      for (uint y = 0; y < 4; y++) {
        for (uint x = 0; x < 4; x++) {
          uint best_s = 0;
          uint64 best_error = 0xFFFFFFFFFFULL;

          uint max_s = 4;
          if (block_type == 1)
            max_s = 3;

          for (uint s = 0; s < max_s; s++) {
            uint64 total_error = 0;

            for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++) {
              const uint block_index = block_indices[block_iter];

              const color_quad_u8& orig_color = m_pBlocks[block_index].m_pixels[y][x];

              const dxt1_block& dst_block = get_block(block_index);

              color_quad_u8 colors[4];
              dxt1_block::get_block_colors(colors, static_cast<uint16>(dst_block.get_low_color()), static_cast<uint16>(dst_block.get_high_color()));

              uint error = color::color_distance(m_params.m_perceptual, orig_color, colors[s], false);

              total_error += error;
            }

            if (total_error < best_error) {
              best_error = total_error;
              best_s = s;
            }
          }

          blk.set_selector(x, y, best_s);

        }  // x
      }    // y

      for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++) {
        const uint block_index = block_indices[block_iter];

        dxt1_block& dst_block = get_block(block_index);

        memcpy(dst_block.m_selectors, blk.m_selectors, sizeof(dst_block.m_selectors));
      }
    }

  }  // cluster_index
}